

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrFragmentOperations.cpp
# Opt level: O0

void __thiscall
rr::FragmentProcessor::executeColorWrite
          (FragmentProcessor *this,int fragNdxOffset,int numSamplesPerFragment,
          Fragment *inputFragments,bool isSRGB,PixelBufferAccess *colorBuffer)

{
  float fVar1;
  int y;
  int z;
  float *pfVar2;
  tcu local_78 [8];
  float local_70 [2];
  VecAccess<float,_4,_3> local_68;
  undefined1 local_50 [8];
  Vec4 combinedColor;
  Fragment *frag;
  int fragSampleNdx;
  int regSampleNdx;
  PixelBufferAccess *colorBuffer_local;
  bool isSRGB_local;
  Fragment *inputFragments_local;
  int numSamplesPerFragment_local;
  int fragNdxOffset_local;
  FragmentProcessor *this_local;
  
  for (frag._4_4_ = 0; frag._4_4_ < 0x40; frag._4_4_ = frag._4_4_ + 1) {
    if ((this->m_sampleRegister[frag._4_4_].isAlive & 1U) != 0) {
      combinedColor.m_data._8_8_ =
           inputFragments + (fragNdxOffset + frag._4_4_ / numSamplesPerFragment);
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_50);
      tcu::Vector<float,_4>::xyz(&local_68,(Vector<float,_4> *)local_50);
      tcu::VecAccess<float,_4,_3>::operator=
                (&local_68,&this->m_sampleRegister[frag._4_4_].blendedRGB);
      fVar1 = this->m_sampleRegister[frag._4_4_].blendedA;
      pfVar2 = tcu::Vector<float,_4>::w((Vector<float,_4> *)local_50);
      *pfVar2 = fVar1;
      if (isSRGB) {
        tcu::linearToSRGB(local_78,(Vec4 *)local_50);
        local_50[0] = local_78[0];
        local_50[1] = local_78[1];
        local_50[2] = local_78[2];
        local_50[3] = local_78[3];
        local_50[4] = local_78[4];
        local_50[5] = local_78[5];
        local_50[6] = local_78[6];
        local_50[7] = local_78[7];
        combinedColor.m_data[0] = local_70[0];
        combinedColor.m_data[1] = local_70[1];
      }
      y = tcu::Vector<int,_2>::x((Vector<int,_2> *)combinedColor.m_data._8_8_);
      z = tcu::Vector<int,_2>::y((Vector<int,_2> *)combinedColor.m_data._8_8_);
      tcu::PixelBufferAccess::setPixel
                (colorBuffer,(Vec4 *)local_50,frag._4_4_ % numSamplesPerFragment,y,z);
    }
  }
  return;
}

Assistant:

void FragmentProcessor::executeColorWrite (int fragNdxOffset, int numSamplesPerFragment, const Fragment* inputFragments, bool isSRGB, const tcu::PixelBufferAccess& colorBuffer)
{
	for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)
	{
		if (m_sampleRegister[regSampleNdx].isAlive)
		{
			int					fragSampleNdx	= regSampleNdx % numSamplesPerFragment;
			const Fragment&		frag			= inputFragments[fragNdxOffset + regSampleNdx/numSamplesPerFragment];
			Vec4				combinedColor;

			combinedColor.xyz()	= m_sampleRegister[regSampleNdx].blendedRGB;
			combinedColor.w()	= m_sampleRegister[regSampleNdx].blendedA;

			if (isSRGB)
				combinedColor = tcu::linearToSRGB(combinedColor);

			colorBuffer.setPixel(combinedColor, fragSampleNdx, frag.pixelCoord.x(), frag.pixelCoord.y());
		}
	}
}